

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void emit_ARB1_dest_modifiers(Context *ctx)

{
  int iVar1;
  uint uVar2;
  size_t in_RDX;
  size_t buflen;
  size_t extraout_RDX;
  size_t buflen_00;
  char dst [64];
  char var [64];
  char acStack_98 [64];
  char local_58 [64];
  
  if ((ctx->dest_arg).result_shift != 0) {
    make_ARB1_destarg_string(ctx,acStack_98,in_RDX);
    uVar2 = (ctx->dest_arg).result_shift - 1;
    in_RDX = buflen;
    if ((uVar2 < 0xf) && ((0x7007U >> (uVar2 & 0x1f) & 1) != 0)) {
      iVar1 = *(int *)(&DAT_0013459c + (ulong)uVar2 * 4);
      get_ARB1_destarg_varname(ctx,local_58,buflen);
      output_line(ctx,"MUL%s, %s, %s;",acStack_98,local_58,&DAT_0013459c + iVar1);
      in_RDX = extraout_RDX;
    }
  }
  if (((((ctx->dest_arg).result_mod & 1) != 0) && (ctx->profile_supports_nv4 == 0)) &&
     (ctx->shader_type != MOJOSHADER_TYPE_PIXEL)) {
    get_ARB1_destarg_varname(ctx,acStack_98,in_RDX);
    make_ARB1_destarg_string(ctx,local_58,buflen_00);
    output_line(ctx,"MIN%s, %s, 1.0;",local_58,acStack_98);
    output_line(ctx,"MAX%s, %s, 0.0;",local_58,acStack_98);
  }
  return;
}

Assistant:

static void emit_ARB1_dest_modifiers(Context *ctx)
{
    const DestArgInfo *arg = &ctx->dest_arg;

    if (arg->result_shift != 0x0)
    {
        char dst[64]; make_ARB1_destarg_string(ctx, dst, sizeof (dst));
        const char *multiplier = NULL;

        switch (arg->result_shift)
        {
            case 0x1: multiplier = "2.0"; break;
            case 0x2: multiplier = "4.0"; break;
            case 0x3: multiplier = "8.0"; break;
            case 0xD: multiplier = "0.125"; break;
            case 0xE: multiplier = "0.25"; break;
            case 0xF: multiplier = "0.5"; break;
        } // switch

        if (multiplier != NULL)
        {
            char var[64]; get_ARB1_destarg_varname(ctx, var, sizeof (var));
            output_line(ctx, "MUL%s, %s, %s;", dst, var, multiplier);
        } // if
    } // if

    if (arg->result_mod & MOD_SATURATE)
    {
        // nv4 and/or pixel shaders just used the "SAT" modifier, instead.
        if ( (!support_nv4(ctx)) && (!shader_is_pixel(ctx)) )
        {
            char var[64]; get_ARB1_destarg_varname(ctx, var, sizeof (var));
            char dst[64]; make_ARB1_destarg_string(ctx, dst, sizeof (dst));
            output_line(ctx, "MIN%s, %s, 1.0;", dst, var);
            output_line(ctx, "MAX%s, %s, 0.0;", dst, var);
        } // if
    } // if
}